

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O0

void __thiscall test_event_listener::on_event(test_event_listener *this,raft_event event)

{
  ostream *poVar1;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI == 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1," becomes a leader");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (in_ESI == 2) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1," becomes a follower");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (in_ESI == 3) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1," catch up all logs");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

virtual void on_event(raft_event event) override
    {
        switch (event)
        {
            case raft_event::become_follower:
                std::cout << srv_id_ << " becomes a follower" << std::endl;
                break;
            case raft_event::become_leader:
                std::cout << srv_id_ << " becomes a leader" << std::endl;
                break;
            case raft_event::logs_catch_up:
                std::cout << srv_id_ << " catch up all logs" << std::endl;
                break;
        }
    }